

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::Reset(CPU *this,uint16_t start)

{
  this->pc = start;
  (this->field_6).ps = '\x10';
  this->sp = 0xff;
  this->A = '\0';
  this->X = '\0';
  this->Y = '\0';
  this->cycles = 0;
  return;
}

Assistant:

void CPU::Reset(uint16_t start)
{
    pc = start;
    sp = 0xFF;
    C = Z = I = D = B = V = N = 0;
    U = 1;
    A = X = Y = 0;
    cycles = 0;
}